

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

ObjectPtr __thiscall ICM::DefFunc::Calc::NumCall::func(NumCall *this,DataList *list)

{
  bool bVar1;
  int iVar2;
  Object **ppOVar3;
  undefined4 extraout_var;
  unsigned_long id;
  Ty<8UL> *__args;
  Ty<8UL> *__args_1;
  int in_ECX;
  lightlist<ICM::Object_*> *in_RDX;
  void *__child_stack;
  DataList *__fn;
  void *in_R8;
  unsigned_long i;
  RIterator<unsigned_long> __end3;
  RIterator<unsigned_long> __begin3;
  unsigned_long local_48;
  RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> local_40;
  RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> *local_30;
  Range<unsigned_long> *__range3;
  Object *tmp;
  DataList *list_local;
  NumCall *this_local;
  
  __fn = list;
  tmp = (Object *)in_RDX;
  list_local = list;
  this_local = this;
  ppOVar3 = Common::lightlist<ICM::Object_*>::front(in_RDX);
  iVar2 = Object::clone(*ppOVar3,(__fn *)__fn,__child_stack,in_ECX,in_R8);
  __range3 = (Range<unsigned_long> *)CONCAT44(extraout_var,iVar2);
  local_48 = 1;
  __begin3.value = Common::lightlist<ICM::Object_*>::size((lightlist<ICM::Object_*> *)tmp);
  Common::Range<unsigned_long>::Range((Range<unsigned_long> *)&local_40,&local_48,&__begin3.value);
  local_30 = &local_40;
  __end3 = Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::begin(local_30);
  i = (unsigned_long)
      Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::end(local_30);
  while( true ) {
    bVar1 = Common::RIterator<unsigned_long>::operator!=(&__end3,(RIterator<unsigned_long> *)&i);
    if (!bVar1) break;
    id = Common::RIterator<unsigned_long>::operator*(&__end3);
    __args = Object::dat<8ul>((Object *)__range3);
    ppOVar3 = Common::lightlist<ICM::Object_*>::operator[]((lightlist<ICM::Object_*> *)tmp,id);
    __args_1 = Object::dat<8ul>(*ppOVar3);
    std::function<void_(long_&,_const_long_&)>::operator()
              ((function<void_(long_&,_const_long_&)> *)&list->_data,__args,__args_1);
    Common::RIterator<unsigned_long>::operator++(&__end3);
  }
  ObjectPtr::ObjectPtr((ObjectPtr *)this,(Object *)__range3);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					Object *tmp = list.front()->clone();
					for (auto i : Range<size_t>(1, list.size()))
						fp(tmp->dat<T_Number>(), list[i]->dat<T_Number>());
					return ObjectPtr(tmp);
				}